

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserialized_statement_verifier.cpp
# Opt level: O3

unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>,_true>
__thiscall
duckdb::DeserializedStatementVerifier::Create
          (DeserializedStatementVerifier *this,SQLStatement *statement,
          optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
          parameters)

{
  SelectStatement *value;
  DeserializedStatementVerifier *this_00;
  pointer *__ptr;
  MemoryStream stream;
  Allocator allocator;
  undefined1 local_b8 [8];
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> local_b0;
  MemoryStream local_a8;
  Allocator local_78;
  _Map_pointer local_58;
  _Alloc_hider _Stack_50;
  _Elt_pointer local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_40;
  _Map_pointer pprStack_30;
  _Elt_pointer local_28;
  
  value = SQLStatement::Cast<duckdb::SelectStatement>(statement);
  Allocator::Allocator(&local_78);
  MemoryStream::MemoryStream(&local_a8,&local_78,0x200);
  aStack_40._8_8_ = (_Elt_pointer)0x0;
  pprStack_30 = (_Map_pointer)0x0;
  local_48 = (_Elt_pointer)0x0;
  aStack_40._M_allocated_capacity = 0;
  local_58 = (_Map_pointer)0x0;
  _Stack_50._M_p = (pointer)0x0;
  local_28 = (_Elt_pointer)0x0;
  SerializationCompatibility::Default();
  BinarySerializer::Serialize<duckdb::SelectStatement>
            (value,&local_a8.super_WriteStream,(SerializationOptions *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_50._M_p != &aStack_40) {
    operator_delete(_Stack_50._M_p);
  }
  MemoryStream::Rewind(&local_a8);
  BinaryDeserializer::Deserialize<duckdb::SelectStatement>
            ((BinaryDeserializer *)local_b8,&local_a8.super_ReadStream);
  this_00 = (DeserializedStatementVerifier *)operator_new(0x50);
  local_b0._M_head_impl = (SQLStatement *)local_b8;
  local_b8 = (undefined1  [8])0x0;
  DeserializedStatementVerifier
            (this_00,(unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                      *)&local_b0,parameters);
  if (local_b0._M_head_impl != (SQLStatement *)0x0) {
    (*(local_b0._M_head_impl)->_vptr_SQLStatement[1])();
  }
  (this->super_StatementVerifier)._vptr_StatementVerifier = (_func_int **)this_00;
  if (local_b8 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_b8 + 8))();
  }
  MemoryStream::~MemoryStream(&local_a8);
  Allocator::~Allocator(&local_78);
  return (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>)
         (unique_ptr<duckdb::StatementVerifier,_std::default_delete<duckdb::StatementVerifier>_>)
         this;
}

Assistant:

unique_ptr<StatementVerifier>
DeserializedStatementVerifier::Create(const SQLStatement &statement,
                                      optional_ptr<case_insensitive_map_t<BoundParameterData>> parameters) {

	auto &select_stmt = statement.Cast<SelectStatement>();
	Allocator allocator;
	MemoryStream stream(allocator);
	BinarySerializer::Serialize(select_stmt, stream);
	stream.Rewind();
	auto result = BinaryDeserializer::Deserialize<SelectStatement>(stream);

	return make_uniq<DeserializedStatementVerifier>(std::move(result), parameters);
}